

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlsa_digital_filter_stability_check.h
# Opt level: O0

void __thiscall sptk::MlsaDigitalFilterStabilityCheck::Buffer::~Buffer(Buffer *this)

{
  Buffer *in_RDI;
  
  ~Buffer(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Buffer() {
    }